

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall
ImDrawList::PushClipRect
          (ImDrawList *this,ImVec2 cr_min,ImVec2 cr_max,bool intersect_with_current_clip_rect)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  undefined7 in_register_00000031;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 in_register_00001248 [56];
  undefined1 auVar10 [64];
  undefined1 auVar11 [16];
  ImVec4 local_20;
  
  auVar10._8_56_ = in_register_00001248;
  auVar10._0_8_ = cr_max;
  auVar9 = auVar10._0_16_;
  auVar8._8_56_ = in_register_00001208;
  auVar8._0_8_ = cr_min;
  auVar6 = auVar8._0_16_;
  local_20._0_8_ = vmovlps_avx(auVar6);
  if ((int)CONCAT71(in_register_00000031,intersect_with_current_clip_rect) != 0) {
    auVar11 = vmovshdup_avx(auVar6);
    fVar1 = (this->_CmdHeader).ClipRect.x;
    fVar2 = (this->_CmdHeader).ClipRect.y;
    if (cr_min.x < fVar1) {
      local_20.x = fVar1;
      auVar6 = ZEXT416((uint)fVar1);
    }
    uVar3._0_4_ = (this->_CmdHeader).ClipRect.z;
    uVar3._4_4_ = (this->_CmdHeader).ClipRect.w;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar3;
    if (auVar11._0_4_ < fVar2) {
      local_20.y = fVar2;
      auVar11 = ZEXT416((uint)fVar2);
    }
    auVar4 = vcmpps_avx(auVar7,auVar9,1);
    auVar4 = vshufps_avx(auVar4,auVar4,0x50);
    uVar5 = vmovmskpd_avx(auVar4);
    if ((uVar5 & 1) == 0) {
      auVar7 = auVar9;
    }
    if ((uVar5 & 2) == 0) {
      auVar9._4_12_ = auVar10._4_12_;
      auVar9._0_4_ = auVar7._0_4_;
    }
    else {
      auVar9._4_4_ = uVar3._4_4_;
      auVar9._0_4_ = auVar7._0_4_;
      auVar9._8_8_ = 0;
    }
    auVar6 = vinsertps_avx(auVar6,auVar11,0x10);
  }
  auVar11 = vcmpps_avx(auVar9,auVar6,2);
  auVar6 = vblendvps_avx(auVar9,auVar6,auVar11);
  local_20._8_8_ = vmovlps_avx(auVar6);
  ImVector<ImVec4>::push_back(&this->_ClipRectStack,&local_20);
  (this->_CmdHeader).ClipRect.x = local_20.x;
  (this->_CmdHeader).ClipRect.y = local_20.y;
  (this->_CmdHeader).ClipRect.z = local_20.z;
  (this->_CmdHeader).ClipRect.w = local_20.w;
  _OnChangedClipRect(this);
  return;
}

Assistant:

void ImDrawList::PushClipRect(ImVec2 cr_min, ImVec2 cr_max, bool intersect_with_current_clip_rect)
{
    ImVec4 cr(cr_min.x, cr_min.y, cr_max.x, cr_max.y);
    if (intersect_with_current_clip_rect)
    {
        ImVec4 current = _CmdHeader.ClipRect;
        if (cr.x < current.x) cr.x = current.x;
        if (cr.y < current.y) cr.y = current.y;
        if (cr.z > current.z) cr.z = current.z;
        if (cr.w > current.w) cr.w = current.w;
    }
    cr.z = ImMax(cr.x, cr.z);
    cr.w = ImMax(cr.y, cr.w);

    _ClipRectStack.push_back(cr);
    _CmdHeader.ClipRect = cr;
    _OnChangedClipRect();
}